

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O0

void * retry_control_clone_option(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  uint *cloned_value;
  LOGGER_LOG l;
  void *result;
  void *value_local;
  char *name_local;
  
  if ((name == (char *)0x0) || (value == (void *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"retry_control_clone_option",0x2f,1,
                "Failed to clone option (either name (%p) or value (%p) are NULL)",name,value);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    iVar1 = strcmp(RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS,name);
    if ((iVar1 == 0) || (iVar1 = strcmp(RETRY_CONTROL_OPTION_MAX_JITTER_PERCENT,name), iVar1 == 0))
    {
      l = (LOGGER_LOG)malloc(4);
      if (l == (LOGGER_LOG)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                    ,"retry_control_clone_option",0x39,1,
                    "Failed to clone option \'%p\' (malloc failed)",name);
        }
        l = (LOGGER_LOG)0x0;
      }
      else {
        *(undefined4 *)l = *value;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                  ,"retry_control_clone_option",0x45,1,
                  "Failed to clone option (option with name \'%s\' is not suppported)",name);
      }
      l = (LOGGER_LOG)0x0;
    }
  }
  return l;
}

Assistant:

static void* retry_control_clone_option(const char* name, const void* value)
{
    void* result;

    if ((name == NULL) || (value == NULL))
    {
        LogError("Failed to clone option (either name (%p) or value (%p) are NULL)", name, value);
        result = NULL;
    }
    else if (strcmp(RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS, name) == 0 ||
            strcmp(RETRY_CONTROL_OPTION_MAX_JITTER_PERCENT, name) == 0)
    {
        unsigned int* cloned_value;

        if ((cloned_value = (unsigned int*)malloc(sizeof(unsigned int))) == NULL)
        {
            LogError("Failed to clone option '%p' (malloc failed)", name);
            result = NULL;
        }
        else
        {
            *cloned_value = *(unsigned int*)value;

            result = (void*)cloned_value;
        }
    }
    else
    {
        LogError("Failed to clone option (option with name '%s' is not suppported)", name);
        result = NULL;
    }

    return result;
}